

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
gch::detail::small_vector_base<std::allocator<int>,6u>::
small_vector_base<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (void *param_1,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> param_2,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> param_3)

{
  size_ty sVar1;
  size_ty count;
  alloc_ty *in_stack_ffffffffffffff78;
  allocator_interface<std::allocator<int>_> *in_stack_ffffffffffffff80;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff90;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff98;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa0;
  
  allocator_interface<std::allocator<int>_>::allocator_interface
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar1 = allocator_interface<std::allocator<int>_>::
          external_range_length<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_long,_false>
                    (in_stack_ffffffffffffff90,
                     (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                     param_1);
  if (sVar1 < 7) {
    small_vector_base<std::allocator<int>,_6U>::set_to_inline_storage
              ((small_vector_base<std::allocator<int>,_6U> *)in_stack_ffffffffffffff80);
    small_vector_base<std::allocator<int>,_6U>::begin_ptr
              ((small_vector_base<std::allocator<int>,_6U> *)0x209a41);
    allocator_interface<std::allocator<int>_>::
    uninitialized_copy<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
              ((allocator_interface<std::allocator<int>_> *)param_3._M_current,
               in_stack_ffffffffffffffa0,param_2,(ptr)param_1);
  }
  else {
    in_stack_ffffffffffffff80 =
         (allocator_interface<std::allocator<int>_> *)
         small_vector_base<std::allocator<int>,_6U>::unchecked_allocate
                   ((small_vector_base<std::allocator<int>,_6U> *)in_stack_ffffffffffffff80,
                    (size_ty)in_stack_ffffffffffffff78);
    small_vector_base<std::allocator<int>,_6U>::set_data_ptr
              ((small_vector_base<std::allocator<int>,_6U> *)in_stack_ffffffffffffff80,
               (ptr)in_stack_ffffffffffffff78);
    small_vector_base<std::allocator<int>,_6U>::set_capacity
              ((small_vector_base<std::allocator<int>,_6U> *)in_stack_ffffffffffffff80,
               (size_ty)in_stack_ffffffffffffff78);
    small_vector_base<std::allocator<int>,_6U>::begin_ptr
              ((small_vector_base<std::allocator<int>,_6U> *)0x209982);
    allocator_interface<std::allocator<int>_>::
    uninitialized_copy<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
              ((allocator_interface<std::allocator<int>_> *)in_stack_ffffffffffffff90._M_current,
               param_3,in_stack_ffffffffffffff98,(ptr)param_1);
  }
  small_vector_base<std::allocator<int>,_6U>::set_size
            ((small_vector_base<std::allocator<int>,_6U> *)in_stack_ffffffffffffff80,
             (size_ty)in_stack_ffffffffffffff78);
  return;
}

Assistant:

GCH_CPP20_CONSTEXPR
      small_vector_base (ForwardIt first, ForwardIt last, std::forward_iterator_tag,
                         const alloc_ty& alloc)
        : alloc_interface (alloc)
      {
        size_ty count = external_range_length (first, last);
        if (InlineCapacity < count)
        {
          set_data_ptr (unchecked_allocate (count));
          set_capacity (count);
          GCH_TRY
          {
            uninitialized_copy (first, last, begin_ptr ());
          }
          GCH_CATCH (...)
          {
            deallocate (data_ptr (), get_capacity ());
            GCH_THROW;
          }
        }